

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O2

char * xmlThrDefTreeIndentString(char *v)

{
  char *pcVar1;
  
  xmlMutexLock(xmlThrDefMutex);
  pcVar1 = xmlTreeIndentStringThrDef;
  xmlTreeIndentStringThrDef = v;
  xmlMutexUnlock(xmlThrDefMutex);
  return pcVar1;
}

Assistant:

const char * xmlThrDefTreeIndentString(const char * v) {
    const char * ret;
    xmlMutexLock(xmlThrDefMutex);
    ret = xmlTreeIndentStringThrDef;
    xmlTreeIndentStringThrDef = v;
    xmlMutexUnlock(xmlThrDefMutex);
    return ret;
}